

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlsavoCtrl.cpp
# Opt level: O2

void __thiscall
AlsavoSession::Connect
          (AlsavoSession *this,string *serverIP,int16_t serverPort,string *serial,string *passwd)

{
  double __x;
  uint uVar1;
  int iVar2;
  Verbosity VVar3;
  time_t tVar4;
  ulong uVar5;
  rep rVar6;
  double __x_00;
  double __x_01;
  double __x_02;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  uchar respdata [16];
  AuthResponse resp;
  AuthIntro intro;
  MD5_CTX ctx;
  char rcvBuf [512];
  
  std::__cxx11::string::_M_assign((string *)&this->m_SerialNo);
  std::__cxx11::string::_M_assign((string *)&this->m_Password);
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  MD5_Init((MD5_CTX *)&ctx);
  MD5_Update((MD5_CTX *)&ctx,(this->m_Password)._M_dataplus._M_p,
             (ulong)(uint)(this->m_Password)._M_string_length);
  MD5_Final(this->m_HashedPW,(MD5_CTX *)&ctx);
  (this->m_DestAddr).sin_zero[4] = '\0';
  (this->m_DestAddr).sin_zero[5] = '\0';
  (this->m_DestAddr).sin_zero[6] = '\0';
  (this->m_DestAddr).sin_zero[7] = '\0';
  (this->m_DestAddr).sin_addr = 0;
  (this->m_DestAddr).sin_zero[0] = '\0';
  (this->m_DestAddr).sin_zero[1] = '\0';
  (this->m_DestAddr).sin_zero[2] = '\0';
  (this->m_DestAddr).sin_zero[3] = '\0';
  (this->m_DestAddr).sin_family = 2;
  (this->m_DestAddr).sin_port = serverPort << 8 | (ushort)serverPort >> 8;
  inet_pton(2,(serverIP->_M_dataplus)._M_p,&(this->m_DestAddr).sin_addr);
  uVar5 = atoll((serial->_M_dataplus)._M_p);
  this->m_SerialQ =
       uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
       (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
       (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
  Disconnect(this);
  uVar1 = rand();
  iVar2 = rand();
  this->m_ClientToken = iVar2 << 0x10 | uVar1;
  iVar2 = socket(2,2,0);
  this->m_Sock = iVar2;
  VVar3 = loguru::current_verbosity_cutoff();
  if (-1 < VVar3) {
    loguru::log(__x_00);
  }
  AuthIntro::AuthIntro(&intro,this->m_ClientToken,this->m_SerialQ);
  sendto(this->m_Sock,&intro,0x38,0,(sockaddr *)&this->m_DestAddr,0x10);
  iVar2 = RecvWithTimeout(this,rcvBuf,0x200,2000);
  if (iVar2 == 0) {
    iVar2 = loguru::current_verbosity_cutoff();
    __x = extraout_XMM0_Qa;
  }
  else if (rcvBuf._16_4_ == 3) {
    *(undefined8 *)&this->m_CSID = rcvBuf._4_8_;
    this->m_ServerToken = rcvBuf._20_4_;
    VVar3 = loguru::current_verbosity_cutoff();
    if (-1 < VVar3) {
      loguru::log(__x_01);
    }
    MD5_Init((MD5_CTX *)&ctx);
    MD5_Update((MD5_CTX *)&ctx,&this->m_ClientToken,4);
    MD5_Update((MD5_CTX *)&ctx,&this->m_ServerToken,4);
    MD5_Update((MD5_CTX *)&ctx,this->m_HashedPW,0x10);
    MD5_Final(respdata,(MD5_CTX *)&ctx);
    AuthResponse::AuthResponse(&resp,this->m_CSID,this->m_DSID,respdata);
    sendto(this->m_Sock,&resp,0x2c,0,(sockaddr *)&this->m_DestAddr,0x10);
    iVar2 = RecvWithTimeout(this,rcvBuf,0x200,2000);
    if (iVar2 == 0) {
      iVar2 = loguru::current_verbosity_cutoff();
      __x = extraout_XMM0_Qa_01;
    }
    else {
      if (rcvBuf._16_4_ == 5) {
        rVar6 = std::chrono::_V2::system_clock::now();
        (this->m_LastPacketRcvTime).__d.__r = rVar6;
        UpdateConnectionStatus(this,Connected);
        VVar3 = loguru::current_verbosity_cutoff();
        if (VVar3 < 0) {
          return;
        }
        loguru::log(__x_02);
        return;
      }
      iVar2 = loguru::current_verbosity_cutoff();
      __x = extraout_XMM0_Qa_02;
    }
  }
  else {
    iVar2 = loguru::current_verbosity_cutoff();
    __x = extraout_XMM0_Qa_00;
  }
  if (-3 < iVar2) {
    loguru::log(__x);
  }
  Disconnect(this);
  return;
}

Assistant:

void Connect(const std::string serverIP, int16_t serverPort, const std::string &serial, const std::string &passwd)
	{
		m_SerialNo = serial;
		m_Password = passwd;

		srand((uint32_t)time(NULL));

		MD5_CTX ctx;
		MD5_Init(&ctx);
		MD5_Update(&ctx, (char*)m_Password.c_str(), (unsigned int)m_Password.length());
		MD5_Final(m_HashedPW, &ctx);

		memset(&m_DestAddr, 0, sizeof(sockaddr_in));
		m_DestAddr.sin_family = AF_INET;
		m_DestAddr.sin_port = htons(serverPort);
		inet_pton(AF_INET, serverIP.c_str(), &m_DestAddr.sin_addr);
		int64_t s = atoll(serial.c_str());
		m_SerialQ = htonll(s);

		Disconnect();

		m_ClientToken = rand() | (rand() << 16);
		m_Sock = socket(AF_INET, SOCK_DGRAM, 0);

		char rcvBuf[512];

		LOG_F(INFO, "Connecting to %s:%d...", serverIP.c_str(), serverPort);

		AuthIntro intro(m_ClientToken, m_SerialQ);
		sendto(m_Sock, (const char*)&intro, 56, 0, (sockaddr*)&m_DestAddr, sizeof(m_DestAddr));
		
		int bytesReceived = RecvWithTimeout(rcvBuf, sizeof(rcvBuf), 2000);

		if (bytesReceived == 0)
		{
			LOG_F(ERROR, "Server not responding, disconnecting");
			Disconnect();
			return;
		}

		AuthChallenge* challenge = (AuthChallenge*)rcvBuf;

		if (!(challenge->act1 == 3 && challenge->act2 == 0 && challenge->act3 == 0 && challenge->act4 == 0))
		{
			LOG_F(ERROR, "Invalid auth challenge packet (pump offline?), disconnecting");
			Disconnect();
			return;
		}

		m_CSID = challenge->hdr.csid;
		m_DSID = challenge->hdr.dsid;
		m_ServerToken = challenge->serverToken;

		LOG_F(INFO, "Received handshake, CSID=%08X, DSID=%08X, server token %08X", m_CSID, m_DSID, m_ServerToken);

		MD5_Init(&ctx);
		MD5_Update(&ctx, &m_ClientToken, 4);
		MD5_Update(&ctx, &m_ServerToken, 4);
		MD5_Update(&ctx, m_HashedPW, 16);

		unsigned char respdata[16];
		MD5_Final(respdata, &ctx);

		AuthResponse resp(m_CSID, m_DSID, respdata);
		sendto(m_Sock, (const char*)&resp, sizeof(resp), 0, (sockaddr*)&m_DestAddr, sizeof(m_DestAddr));

		bytesReceived = RecvWithTimeout(rcvBuf, sizeof(rcvBuf), 2000);

		if (bytesReceived == 0)
		{
			LOG_F(ERROR, "Server not responding to auth response, disconnecting");
			Disconnect();
			return;
		}

		uint32_t act = *(uint32_t*)(&rcvBuf[sizeof(PacketHeader)]);
		if (act != 0x00000005)
		{
			LOG_F(ERROR, "Server returned error in auth, disconnecting");
			Disconnect();
			return;

		}
		m_LastPacketRcvTime = std::chrono::system_clock::now();
		UpdateConnectionStatus(ConnectionStatus::Connected);

		LOG_F(INFO, "Connection complete.");

		return;
	}